

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::cmMakefile
          (cmMakefile *this,cmGlobalGenerator *globalGenerator,cmStateSnapshot *snapshot)

{
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar1;
  bool bVar2;
  cmake *pcVar3;
  cmState *this_00;
  size_type sVar4;
  cmSourceGroup local_2b8;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  PolicyMap local_68;
  cmStateSnapshot local_48;
  cmStateSnapshot *local_20;
  cmStateSnapshot *snapshot_local;
  cmGlobalGenerator *globalGenerator_local;
  cmMakefile *this_local;
  
  local_20 = snapshot;
  snapshot_local = (cmStateSnapshot *)globalGenerator;
  globalGenerator_local = (cmGlobalGenerator *)this;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque(&this->FindPackageModuleStack);
  std::set<cmListFileContext,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>::set
            (&this->CMP0054ReportedIds);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
  ::unordered_map(&this->Targets);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->AliasTargets);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(&this->SourceFiles);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>_>
  ::map(&this->Tests);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->SystemIncludeDirectories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ListFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->OutputFiles);
  std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::vector
            (&this->InstallGenerators);
  std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::vector(&this->TestGenerators);
  std::__cxx11::string::string((string *)&this->ComplainFileRegularExpression);
  std::__cxx11::string::string((string *)&this->DefineFlags);
  std::__cxx11::string::string((string *)&this->DefineFlagsOrig);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector(&this->SourceGroups);
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::vector(&this->FinalPassCommands);
  this->GlobalGenerator = (cmGlobalGenerator *)snapshot_local;
  (this->StateSnapshot).Position.Position = (local_20->Position).Position;
  pcVar1 = (local_20->Position).Tree;
  (this->StateSnapshot).State = local_20->State;
  (this->StateSnapshot).Position.Tree = pcVar1;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,local_20);
  std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::vector
            (&this->FunctionBlockers);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->FunctionBlockerBarriers)
  ;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)&this->LoopBlockCounter);
  cmsys::RegularExpression::RegularExpression(&this->cmDefineRegex);
  cmsys::RegularExpression::RegularExpression(&this->cmDefine01Regex);
  cmsys::RegularExpression::RegularExpression(&this->cmAtVarRegex);
  cmsys::RegularExpression::RegularExpression(&this->cmNamedCurly);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector(&this->UnConfiguredDirectories);
  std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::vector
            (&this->ExportBuildFileGenerators);
  std::
  vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ::vector(&this->EvaluationFiles);
  std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::vector
            (&this->ExecutionStatusStack);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::vector(&this->ImportedTargetsOwned);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
  ::unordered_map(&this->ImportedTargets);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  ::unordered_map(&this->OutputToSource);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(&this->QtUiFilesWithOptions);
  this->IsSourceFileTryCompile = false;
  pcVar3 = GetCMakeInstance(this);
  bVar2 = cmake::GetWarnUnused(pcVar3);
  this->WarnUnused = bVar2;
  pcVar3 = GetCMakeInstance(this);
  bVar2 = cmake::GetCheckSystemVars(pcVar3);
  this->CheckSystemVars = bVar2;
  this->SuppressWatches = false;
  std::__cxx11::string::operator=((string *)&this->ComplainFileRegularExpression,"^$");
  std::__cxx11::string::operator=((string *)&this->DefineFlags," ");
  cmsys::RegularExpression::compile
            (&this->cmDefineRegex,"#([ \t]*)cmakedefine[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile
            (&this->cmDefine01Regex,"#([ \t]*)cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile(&this->cmAtVarRegex,"(@[A-Za-z_0-9/.+-]+@)");
  cmsys::RegularExpression::compile(&this->cmNamedCurly,"^[A-Za-z0-9/_.+-]+{");
  this_00 = cmStateSnapshot::GetState(&this->StateSnapshot);
  cmState::CreatePolicyScopeSnapshot(&local_48,this_00,&this->StateSnapshot);
  (this->StateSnapshot).Position.Position = local_48.Position.Position;
  (this->StateSnapshot).State = local_48.State;
  (this->StateSnapshot).Position.Tree = local_48.Position.Tree;
  local_68.Status.super__Base_bitset<4UL>._M_w[2] = 0;
  local_68.Status.super__Base_bitset<4UL>._M_w[3] = 0;
  local_68.Status.super__Base_bitset<4UL>._M_w[0] = 0;
  local_68.Status.super__Base_bitset<4UL>._M_w[1] = 0;
  cmPolicies::PolicyMap::PolicyMap(&local_68);
  PushPolicy(this,false,&local_68);
  PushLoopBlockBarrier(this);
  this->CheckCMP0000 = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"",&local_89);
  AddSourceGroup(this,&local_88,"^.*$");
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"Source Files",&local_b1);
  AddSourceGroup(this,&local_b0,
                 "\\.(C|M|c|c\\+\\+|cc|cpp|cxx|f|f90|for|fpp|ftn|m|mm|rc|def|r|odl|idl|hpj|bat)$");
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"Header Files",&local_d9);
  AddSourceGroup(this,&local_d8,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"CMake Rules",&local_101);
  AddSourceGroup(this,&local_100,"\\.rule$");
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"Resources",&local_129);
  AddSourceGroup(this,&local_128,"\\.(pdf|plist|png|jpeg|jpg|storyboard|xcassets)$");
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"Object Files",&local_151);
  AddSourceGroup(this,&local_150,"\\.(lo|o|obj)$");
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  sVar4 = std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::size(&this->SourceGroups);
  this->ObjectLibrariesSourceGroupIndex = sVar4;
  cmSourceGroup::cmSourceGroup(&local_2b8,"Object Libraries","^MATCH_NO_SOURCES$",(char *)0x0);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::push_back
            (&this->SourceGroups,&local_2b8);
  cmSourceGroup::~cmSourceGroup(&local_2b8);
  return;
}

Assistant:

cmMakefile::cmMakefile(cmGlobalGenerator* globalGenerator,
                       cmStateSnapshot const& snapshot)
  : GlobalGenerator(globalGenerator)
  , StateSnapshot(snapshot)
  , Backtrace(snapshot)
{
  this->IsSourceFileTryCompile = false;

  this->WarnUnused = this->GetCMakeInstance()->GetWarnUnused();
  this->CheckSystemVars = this->GetCMakeInstance()->GetCheckSystemVars();

  this->SuppressWatches = false;

  // Setup the default include complaint regular expression (match nothing).
  this->ComplainFileRegularExpression = "^$";

  this->DefineFlags = " ";

  this->cmDefineRegex.compile("#([ \t]*)cmakedefine[ \t]+([A-Za-z_0-9]*)");
  this->cmDefine01Regex.compile("#([ \t]*)cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  this->cmAtVarRegex.compile("(@[A-Za-z_0-9/.+-]+@)");
  this->cmNamedCurly.compile("^[A-Za-z0-9/_.+-]+{");

  this->StateSnapshot =
    this->StateSnapshot.GetState()->CreatePolicyScopeSnapshot(
      this->StateSnapshot);

  // Enter a policy level for this directory.
  this->PushPolicy();

  // push empty loop block
  this->PushLoopBlockBarrier();

  // By default the check is not done.  It is enabled by
  // cmListFileCache in the top level if necessary.
  this->CheckCMP0000 = false;

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->AddSourceGroup("", "^.*$");
  this->AddSourceGroup("Source Files", CM_SOURCE_REGEX);
  this->AddSourceGroup("Header Files", CM_HEADER_REGEX);
  this->AddSourceGroup("CMake Rules", "\\.rule$");
  this->AddSourceGroup("Resources", CM_RESOURCE_REGEX);
  this->AddSourceGroup("Object Files", "\\.(lo|o|obj)$");

  this->ObjectLibrariesSourceGroupIndex = this->SourceGroups.size();
  this->SourceGroups.push_back(
    cmSourceGroup("Object Libraries", "^MATCH_NO_SOURCES$"));
#endif
}